

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve-names.cc
# Opt level: O0

void __thiscall
wabt::anon_unknown_16::NameResolver::VisitElemSegment(NameResolver *this,ElemSegment *segment)

{
  bool bVar1;
  reference pEVar2;
  ElemExpr *elem_expr;
  iterator __end1;
  iterator __begin1;
  ElemExprVector *__range1;
  ElemSegment *segment_local;
  NameResolver *this_local;
  
  ResolveTableVar(this,&segment->table_var);
  ExprVisitor::VisitExprList(&this->visitor_,&segment->offset);
  __end1 = std::vector<wabt::ElemExpr,_std::allocator<wabt::ElemExpr>_>::begin(&segment->elem_exprs)
  ;
  elem_expr = (ElemExpr *)
              std::vector<wabt::ElemExpr,_std::allocator<wabt::ElemExpr>_>::end
                        (&segment->elem_exprs);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<wabt::ElemExpr_*,_std::vector<wabt::ElemExpr,_std::allocator<wabt::ElemExpr>_>_>
                                *)&elem_expr);
    if (!bVar1) break;
    pEVar2 = __gnu_cxx::
             __normal_iterator<wabt::ElemExpr_*,_std::vector<wabt::ElemExpr,_std::allocator<wabt::ElemExpr>_>_>
             ::operator*(&__end1);
    if (pEVar2->kind == RefFunc) {
      ResolveFuncVar(this,&pEVar2->var);
    }
    __gnu_cxx::
    __normal_iterator<wabt::ElemExpr_*,_std::vector<wabt::ElemExpr,_std::allocator<wabt::ElemExpr>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void NameResolver::VisitElemSegment(ElemSegment* segment) {
  ResolveTableVar(&segment->table_var);
  visitor_.VisitExprList(segment->offset);
  for (ElemExpr& elem_expr : segment->elem_exprs) {
    if (elem_expr.kind == ElemExprKind::RefFunc) {
      ResolveFuncVar(&elem_expr.var);
    }
  }
}